

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

int Ivy_GraphToNetworkCount
              (Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int NodeMax,int LevelMax)

{
  int iVar1;
  Dec_Node_t *pDVar2;
  Dec_Node_t *pDVar3;
  Dec_Node_t *pDVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  uint local_8c;
  uint local_6c;
  int LevelOld;
  int LevelNew;
  int Counter;
  int i;
  Ivy_Obj_t *pAnd1;
  Ivy_Obj_t *pAnd0;
  Ivy_Obj_t *pAnd;
  Dec_Node_t *pNode1;
  Dec_Node_t *pNode0;
  Dec_Node_t *pNode;
  int LevelMax_local;
  int NodeMax_local;
  Dec_Graph_t *pGraph_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Dec_GraphIsConst(pGraph);
  if ((iVar1 == 0) && (iVar1 = Dec_GraphIsVar(pGraph), iVar1 == 0)) {
    for (LevelNew = 0; LevelNew < pGraph->nLeaves; LevelNew = LevelNew + 1) {
      pDVar2 = Dec_GraphNode(pGraph,LevelNew);
      pIVar5 = Ivy_Regular((Ivy_Obj_t *)(pDVar2->field_2).pFunc);
      *(uint *)&pDVar2->field_0x10 =
           *(uint *)&pDVar2->field_0x10 & 0xffffc000 | *(uint *)&pIVar5->field_0x8 >> 0xb & 0x3fff;
    }
    LevelOld = 0;
    for (LevelNew = pGraph->nLeaves; LevelNew < pGraph->nSize; LevelNew = LevelNew + 1) {
      pDVar2 = Dec_GraphNode(pGraph,LevelNew);
      pDVar3 = Dec_GraphNode(pGraph,(uint)pDVar2->eEdge0 >> 1 & 0x3fffffff);
      pDVar4 = Dec_GraphNode(pGraph,(uint)pDVar2->eEdge1 >> 1 & 0x3fffffff);
      pAnd1 = (Ivy_Obj_t *)(pDVar3->field_2).pFunc;
      _Counter = (Ivy_Obj_t *)(pDVar4->field_2).pFunc;
      if ((pAnd1 == (Ivy_Obj_t *)0x0) || (_Counter == (Ivy_Obj_t *)0x0)) {
        pAnd0 = (Ivy_Obj_t *)0x0;
      }
      else {
        pAnd1 = Ivy_NotCond(pAnd1,(uint)pDVar2->eEdge0 & 1);
        _Counter = Ivy_NotCond(_Counter,(uint)pDVar2->eEdge1 & 1);
        pIVar5 = Ivy_ObjCreateGhost(p,pAnd1,_Counter,IVY_AND,IVY_INIT_NONE);
        pAnd0 = Ivy_TableLookup(p,pIVar5);
        pIVar5 = Ivy_Regular(pAnd0);
        if (pIVar5 == pRoot) {
          return -1;
        }
      }
      if (pAnd0 == (Ivy_Obj_t *)0x0) {
LAB_00a46c52:
        LevelOld = LevelOld + 1;
        if (NodeMax < LevelOld) {
          return -1;
        }
      }
      else {
        pIVar5 = Ivy_Regular(pAnd0);
        iVar1 = Ivy_ObjIsTravIdCurrent(p,pIVar5);
        if (iVar1 != 0) goto LAB_00a46c52;
      }
      if ((*(uint *)&pDVar4->field_0x10 & 0x3fff) < (*(uint *)&pDVar3->field_0x10 & 0x3fff)) {
        local_8c = *(uint *)&pDVar3->field_0x10;
      }
      else {
        local_8c = *(uint *)&pDVar4->field_0x10;
      }
      local_8c = local_8c & 0x3fff;
      local_6c = local_8c + 1;
      if (pAnd0 != (Ivy_Obj_t *)0x0) {
        pIVar5 = Ivy_Regular(pAnd0);
        if (pIVar5 == p->pConst1) {
          local_6c = 0;
        }
        else {
          pIVar5 = Ivy_Regular(pAnd0);
          pIVar6 = Ivy_Regular(pAnd1);
          if (pIVar5 == pIVar6) {
            pIVar5 = Ivy_Regular(pAnd1);
            local_6c = *(uint *)&pIVar5->field_0x8 >> 0xb;
          }
          else {
            pIVar5 = Ivy_Regular(pAnd0);
            pIVar6 = Ivy_Regular(_Counter);
            if (pIVar5 == pIVar6) {
              pIVar5 = Ivy_Regular(_Counter);
              local_6c = *(uint *)&pIVar5->field_0x8 >> 0xb;
            }
          }
        }
        Ivy_Regular(pAnd0);
      }
      if (LevelMax < (int)local_6c) {
        return -1;
      }
      (pDVar2->field_2).pFunc = pAnd0;
      *(uint *)&pDVar2->field_0x10 = *(uint *)&pDVar2->field_0x10 & 0xffffc000 | local_6c & 0x3fff;
    }
    p_local._4_4_ = LevelOld;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_GraphToNetworkCount( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax, int LevelMax )
{
    Dec_Node_t * pNode, * pNode0, * pNode1;
    Ivy_Obj_t * pAnd, * pAnd0, * pAnd1;
    int i, Counter, LevelNew, LevelOld;
    // check for constant function or a literal
    if ( Dec_GraphIsConst(pGraph) || Dec_GraphIsVar(pGraph) )
        return 0;
    // set the levels of the leaves
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->Level = Ivy_Regular((Ivy_Obj_t *)pNode->pFunc)->Level;
    // compute the AIG size after adding the internal nodes
    Counter = 0;
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Dec_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Dec_GraphNode( pGraph, pNode->eEdge1.Node );
        // get the AIG nodes corresponding to the children 
        pAnd0 = (Ivy_Obj_t *)pNode0->pFunc; 
        pAnd1 = (Ivy_Obj_t *)pNode1->pFunc; 
        if ( pAnd0 && pAnd1 )
        {
            // if they are both present, find the resulting node
            pAnd0 = Ivy_NotCond( pAnd0, pNode->eEdge0.fCompl );
            pAnd1 = Ivy_NotCond( pAnd1, pNode->eEdge1.fCompl );
            pAnd  = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pAnd0, pAnd1, IVY_AND, IVY_INIT_NONE) );
            // return -1 if the node is the same as the original root
            if ( Ivy_Regular(pAnd) == pRoot )
                return -1;
        }
        else
            pAnd = NULL;
        // count the number of added nodes
        if ( pAnd == NULL || Ivy_ObjIsTravIdCurrent(p, Ivy_Regular(pAnd)) )
        {
            if ( ++Counter > NodeMax )
                return -1;
        }
        // count the number of new levels
        LevelNew = 1 + RWT_MAX( pNode0->Level, pNode1->Level );
        if ( pAnd )
        {
            if ( Ivy_Regular(pAnd) == p->pConst1 )
                LevelNew = 0;
            else if ( Ivy_Regular(pAnd) == Ivy_Regular(pAnd0) )
                LevelNew = (int)Ivy_Regular(pAnd0)->Level;
            else if ( Ivy_Regular(pAnd) == Ivy_Regular(pAnd1) )
                LevelNew = (int)Ivy_Regular(pAnd1)->Level;
            LevelOld = (int)Ivy_Regular(pAnd)->Level;
//            assert( LevelNew == LevelOld );
        }
        if ( LevelNew > LevelMax )
            return -1;
        pNode->pFunc = pAnd;
        pNode->Level = LevelNew;
    }
    return Counter;
}